

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::initialize
          (basic_csv_parser<char,_std::allocator<char>_> *this)

{
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *this_00;
  csv_mode in_EAX;
  undefined8 local_18;
  
  this_00 = &this->stack_;
  local_18._0_4_ = in_EAX;
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::reserve(this_00,3)
  ;
  local_18 = (ulong)(csv_mode)local_18;
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
  emplace_back<jsoncons::csv::csv_mode>(this_00,(csv_mode *)((long)&local_18 + 4));
  local_18 = CONCAT44(local_18._4_4_,(this->header_lines_ == 0) + 1);
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
  emplace_back<jsoncons::csv::csv_mode>(this_00,(csv_mode *)&local_18);
  return;
}

Assistant:

void initialize()
    {
        stack_.reserve(default_depth);
        stack_.push_back(csv_mode::initial);
        stack_.push_back((header_lines_ > 0) ? csv_mode::header : csv_mode::data);
    }